

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_StoPrintOne(Nf_Man_t *p,int Count,int t,int i,int GateId,Nf_Cfg_t Mat)

{
  Mio_Cell2_t *pMVar1;
  word t_00;
  int iVar2;
  word *pTruth;
  int SuppSize;
  int nVarsInit;
  char *__format;
  int v;
  int iVar;
  uint uVar3;
  byte bVar4;
  
  pMVar1 = p->pCells;
  pTruth = Vec_MemReadEntry(p->vTtMem,t);
  t_00 = *pTruth;
  nVarsInit = 0;
  for (iVar = 0; iVar != 6; iVar = iVar + 1) {
    iVar2 = Abc_Tt6HasVar(t_00,iVar);
    nVarsInit = nVarsInit + iVar2;
  }
  bVar4 = 0;
  printf("%6d : ",(ulong)(uint)Count);
  printf("%6d : ",(ulong)(uint)t);
  printf("%6d : ",(ulong)(uint)i);
  printf("Gate %16s  ",pMVar1[GateId].pName);
  printf("Area =%8.2f  ",(double)pMVar1[GateId].AreaF);
  printf("In = %d   ",(ulong)(*(uint *)&pMVar1[GateId].field_0x10 >> 0x1c));
  __format = " compl ";
  if (((uint)Mat & 1) == 0) {
    __format = "       ";
  }
  printf(__format);
  for (uVar3 = 0; uVar3 < *(uint *)&pMVar1[GateId].field_0x10 >> 0x1c; uVar3 = uVar3 + 1) {
    putchar((((uint)Mat >> 8) >> (bVar4 & 0x1f) & 7) +
            (((uint)Mat >> 1 & 0x7f) >> ((byte)uVar3 & 0x1f) & 1) * -0x20 + 0x61);
    bVar4 = bVar4 + 3;
  }
  printf("  ");
  Dau_DsdPrintFromTruth(pTruth,nVarsInit);
  return;
}

Assistant:

void Nf_StoPrintOne( Nf_Man_t * p, int Count, int t, int i, int GateId, Nf_Cfg_t Mat )
{
    Mio_Cell2_t * pC = p->pCells + GateId;
    word * pTruth = Vec_MemReadEntry(p->vTtMem, t);
    int k, nSuppSize = Abc_TtSupportSize(pTruth, 6);
    printf( "%6d : ", Count );
    printf( "%6d : ", t );
    printf( "%6d : ", i );
    printf( "Gate %16s  ",   pC->pName );
    printf( "Area =%8.2f  ", pC->AreaF );
    printf( "In = %d   ",    pC->nFanins );
    if ( Mat.fCompl )
        printf( " compl " );
    else
        printf( "       " );
    for ( k = 0; k < (int)pC->nFanins; k++ )
    {
        int fComplF = (Mat.Phase >> k) & 1;
        int iFanin  = (Mat.Perm >> (3*k)) & 7;
        printf( "%c", 'a' + iFanin - fComplF * ('a' - 'A') );
    }
    printf( "  " );
    Dau_DsdPrintFromTruth( pTruth, nSuppSize );
}